

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

wchar_t * noedit_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t wVar1;
  wchar_t wVar2;
  el_line_t *peVar3;
  int *piVar4;
  wchar_t *local_30;
  wchar_t num;
  el_line_t *lp;
  wchar_t *nread_local;
  EditLine *el_local;
  
  peVar3 = &el->el_line;
  while ((wVar1 = (*el->el_read->read_char)(el,(el->el_line).lastchar), wVar1 == L'\x01' &&
         ((((el->el_line).lastchar + 1 < (el->el_line).limit ||
           (wVar2 = ch_enlargebufs(el,2), wVar2 != L'\0')) &&
          ((el->el_line).lastchar = (el->el_line).lastchar + 1, (el->el_flags & 8U) == 0))))) {
    if (((el->el_line).lastchar[-1] == L'\r') || ((el->el_line).lastchar[-1] == L'\n')) break;
  }
  if ((wVar1 == L'\xffffffff') && (piVar4 = __errno_location(), *piVar4 == 4)) {
    (el->el_line).lastchar = peVar3->buffer;
  }
  (el->el_line).cursor = (el->el_line).lastchar;
  *(el->el_line).lastchar = L'\0';
  *nread = (wchar_t)((long)(el->el_line).lastchar - (long)peVar3->buffer >> 2);
  if (*nread == L'\0') {
    local_30 = (wchar_t *)0x0;
  }
  else {
    local_30 = peVar3->buffer;
  }
  return local_30;
}

Assistant:

static const wchar_t *
noedit_wgets(EditLine *el, int *nread)
{
	el_line_t	*lp = &el->el_line;
	int		 num;

	while ((num = (*el->el_read->read_char)(el, lp->lastchar)) == 1) {
		if (lp->lastchar + 1 >= lp->limit &&
		    !ch_enlargebufs(el, (size_t)2))
			break;
		lp->lastchar++;
		if (el->el_flags & UNBUFFERED ||
		    lp->lastchar[-1] == '\r' ||
		    lp->lastchar[-1] == '\n')
			break;
	}
	if (num == -1 && errno == EINTR)
		lp->lastchar = lp->buffer;
	lp->cursor = lp->lastchar;
	*lp->lastchar = '\0';
	*nread = (int)(lp->lastchar - lp->buffer);
	return *nread ? lp->buffer : NULL;
}